

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

void __thiscall flatbuffers::FlatBufPrinter::Print(FlatBufPrinter *this,char *s)

{
  char *pcVar1;
  bool bVar2;
  long *local_48 [2];
  long local_38 [2];
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    do {
      std::__cxx11::string::_M_replace_aux
                ((ulong)this->str_,this->str_->_M_string_length,0,
                 (char)this->indentation_size_ * (char)this->indent_);
      pcVar1 = strchr(s,10);
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::append((char *)this->str_);
        bVar2 = false;
      }
      else {
        pcVar1 = pcVar1 + 1;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_48,s,pcVar1);
        std::__cxx11::string::_M_append((char *)this->str_,(ulong)local_48[0]);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        bVar2 = *pcVar1 != '\0';
        s = pcVar1;
      }
    } while (bVar2);
  }
  return;
}

Assistant:

void Print(const char *s) {
    if (s == nullptr || *s == '\0') { return; }
    // Add this string, but for each part separated by \n, add indentation.
    for (;;) {
      // Current indentation.
      str_->insert(str_->end(), indent_ * indentation_size_, indentation_type_);
      // See if this contains more than one line.
      const char *lf = strchr(s, '\n');
      if (lf) {
        (*str_) += std::string(s, lf + 1);
        s = lf + 1;
        if (!*s) break;  // Only continue if there's more lines.
      } else {
        (*str_) += s;
        break;
      }
    }
  }